

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O0

void __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
::SingleFileIndexedStorage
          (SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
           *this,path *storageFilePath,shared_ptr<supermap::io::FileManager> *fileManager,
          InnerRegisterSupplier *registerSupplier)

{
  path *in_RDX;
  shared_ptr<supermap::io::FileManager> *in_RDI;
  TemporaryFile *in_stack_ffffffffffffff68;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>_()>
  *in_stack_ffffffffffffff70;
  path *__args;
  path local_40;
  
  __args = &local_40;
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>_()>
  ::function(in_stack_ffffffffffffff70,
             (function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>_()>
              *)in_stack_ffffffffffffff68);
  IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
  ::OrderedStorage((IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>
                    *)in_stack_ffffffffffffff70,(InnerRegisterSupplier *)in_stack_ffffffffffffff68);
  std::
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>_()>
  ::~function((function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>_()>
               *)0x28f80d);
  (in_RDI->super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR_append_00390420;
  std::
  make_shared<supermap::io::TemporaryFile,std::filesystem::__cxx11::path_const&,std::shared_ptr<supermap::io::FileManager>>
            (__args,in_RDI);
  std::__shared_ptr_access<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x28f847);
  io::TemporaryFile::getFileManager(in_stack_ffffffffffffff68);
  std::__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x28f863);
  io::FileManager::create((FileManager *)in_RDI,in_RDX);
  std::shared_ptr<supermap::io::FileManager>::~shared_ptr
            ((shared_ptr<supermap::io::FileManager> *)0x28f87f);
  return;
}

Assistant:

explicit SingleFileIndexedStorage(const std::filesystem::path &storageFilePath,
                                      std::shared_ptr<io::FileManager> fileManager,
                                      InnerRegisterSupplier registerSupplier)
        : IndexedStorage<T, IndexT, RegisterInfo>(std::move(registerSupplier)),
          storageFile_(std::make_shared<io::TemporaryFile>(storageFilePath, std::move(fileManager))) {
        storageFile_->getFileManager()->create(storageFilePath);
    }